

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImageLevel.cpp
# Opt level: O0

void __thiscall Imf_3_2::ImageLevel::throwBadChannelName(ImageLevel *this,string *name)

{
  ostream *poVar1;
  ArgExc *this_00;
  string *in_RSI;
  stringstream _iex_throw_s;
  stringstream local_198 [16];
  ostream local_188 [376];
  string *local_10;
  
  local_10 = in_RSI;
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"Attempt to access non-existent image channel \"");
  poVar1 = std::operator<<(poVar1,local_10);
  std::operator<<(poVar1,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this_00,local_198);
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
ImageLevel::throwBadChannelName (const string& name) const
{
    THROW (
        ArgExc,
        "Attempt to access non-existent "
        "image channel \""
            << name << "\".");
}